

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O1

coda_mem_special * coda_mem_no_data_new(coda_format format)

{
  coda_type_record *definition;
  coda_mem_special *type;
  coda_type_special *pcVar1;
  coda_mem_data *pcVar2;
  coda_mem_record *pcVar3;
  
  type = (coda_mem_special *)malloc(0x28);
  if (type == (coda_mem_special *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x28,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                   ,0x3f5);
    return (coda_mem_special *)0x0;
  }
  type->backend = coda_backend_memory;
  type->definition = (coda_type_special *)0x0;
  type->tag = tag_mem_special;
  type->attributes = (coda_dynamic_type *)0x0;
  type->base_type = (coda_dynamic_type *)0x0;
  pcVar1 = coda_type_no_data_singleton(format);
  type->definition = pcVar1;
  if (pcVar1 != (coda_type_special *)0x0) {
    pcVar1->retain_count = pcVar1->retain_count + 1;
    pcVar2 = coda_mem_raw_new((coda_type_raw *)pcVar1->base_type,(coda_dynamic_type *)0x0,
                              (coda_product *)0x0,0,(uint8_t *)0x0);
    type->base_type = (coda_dynamic_type *)pcVar2;
    if (pcVar2 != (coda_mem_data *)0x0) {
      definition = type->definition->attributes;
      if (definition == (coda_type_record *)0x0) {
        return type;
      }
      pcVar3 = coda_mem_record_new(definition,(coda_dynamic_type *)0x0);
      type->attributes = (coda_dynamic_type *)pcVar3;
      if (pcVar3 != (coda_mem_record *)0x0) {
        return type;
      }
    }
  }
  coda_mem_type_delete((coda_dynamic_type *)type);
  return (coda_mem_special *)0x0;
}

Assistant:

coda_mem_special *coda_mem_no_data_new(coda_format format)
{
    coda_mem_special *type;
    coda_type_raw *base_definition;

    type = (coda_mem_special *)malloc(sizeof(coda_mem_special));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_mem_special), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_memory;
    type->definition = NULL;
    type->tag = tag_mem_special;
    type->attributes = NULL;
    type->base_type = NULL;

    type->definition = coda_type_no_data_singleton(format);
    if (type->definition == NULL)
    {
        coda_mem_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    type->definition->retain_count++;
    base_definition = (coda_type_raw *)((coda_type_special *)type->definition)->base_type;
    type->base_type = (coda_dynamic_type *)coda_mem_raw_new(base_definition, NULL, NULL, 0, NULL);
    if (type->base_type == NULL)
    {
        coda_mem_type_delete((coda_dynamic_type *)type);
        return NULL;
    }

    if (create_attributes_record((coda_mem_type *)type) != 0)
    {
        coda_mem_type_delete((coda_dynamic_type *)type);
        return NULL;
    }

    return type;
}